

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O2

Macros * __thiscall pstack::Dwarf::Unit::getMacros(Unit *this)

{
  AttrName name;
  Info *__args_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *__p;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long lVar3;
  long lVar4;
  Macros *pMVar5;
  DIE local_c0;
  undefined1 local_98 [8];
  Attribute a;
  intmax_t local_58;
  Unit *local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  uint local_34;
  
  pMVar5 = (this->macros)._M_t.
           super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
           .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
  if (pMVar5 == (Macros *)0x0) {
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->macros;
    local_50 = this;
    root(&local_c0,this);
    stack0xffffffffffffff9c = 0x7900002119;
    lVar3 = 0;
    do {
      lVar4 = lVar3;
      if (lVar4 == 0xc) break;
      name = *(AttrName *)((long)&a.formp + lVar4 + 4);
      DIE::attribute((Attribute *)local_98,&local_c0,name,false);
      _Var1 = a.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      if (a.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __args_1 = local_50->dwarf;
        local_58 = DIE::Attribute::operator_cast_to_long((Attribute *)local_98);
        local_34 = name == DW_AT_macro_info ^ 5;
        std::make_unique<pstack::Dwarf::Macros,pstack::Dwarf::Info_const&,long,int>
                  ((Info *)&stack0xffffffffffffffb8,(long *)__args_1,(int *)&local_58);
        _Var2._M_pi = local_40._M_pi;
        __p = local_48;
        local_48 = (element_type *)0x0;
        std::__uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>::
        reset((__uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_> *
              )local_40._M_pi,(pointer)__p);
        std::unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>::
        ~unique_ptr((unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
                     *)&stack0xffffffffffffffb8);
        pMVar5 = (((__uniq_ptr_data<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>,_true,_true>
                    *)&(_Var2._M_pi)->_vptr__Sp_counted_base)->
                 super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
                 .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
      }
      DIE::~DIE((DIE *)local_98);
      lVar3 = lVar4 + 4;
    } while (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
    DIE::~DIE(&local_c0);
    if (lVar4 == 0xc) {
      pMVar5 = (((__uniq_ptr_data<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>,_true,_true>
                  *)&(local_40._M_pi)->_vptr__Sp_counted_base)->
               super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
               )._M_t.
               super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
               .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
    }
  }
  return pMVar5;
}

Assistant:

const Macros *
Unit::getMacros()
{
    if (macros == nullptr) {
       const DIE &root_ = root();
       for (auto i : { DW_AT_GNU_macros, DW_AT_macros, DW_AT_macro_info }) {
          auto a = root_.attribute(i);
          if (a.valid()) {
              macros = std::make_unique<Macros>(*dwarf, intmax_t(a), i == DW_AT_macro_info ? 4 : 5);
              return macros.get();
          }
       }
    }
    return macros.get();
}